

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

int print_ts2cb(char *fn)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  uint32 n_ts;
  uint32 *map;
  uint32 n_cb;
  uint local_2c;
  uint32 *local_28;
  uint32 local_1c;
  
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/printp/main.c"
          ,0x60,"Reading %s\n",fn);
  iVar1 = s3ts2cb_read(fn,&local_28,&local_2c,&local_1c);
  iVar2 = -1;
  if ((iVar1 == 0) && (iVar2 = 0, local_2c != 0)) {
    iVar2 = 0;
    uVar3 = 0;
    do {
      printf("%d: %d\n",uVar3 & 0xffffffff,(ulong)local_28[uVar3]);
      uVar3 = uVar3 + 1;
    } while (uVar3 < local_2c);
  }
  return iVar2;
}

Assistant:

int
print_ts2cb(const char *fn)
{
    uint32 *map;
    uint32 n_ts, n_cb;
    uint32 i;

    E_INFO("Reading %s\n",  fn);

    if (s3ts2cb_read(fn, &map, &n_ts, &n_cb) != S3_SUCCESS)
	return S3_ERROR;

    for (i = 0; i < n_ts; i++) {
	printf("%d: %d\n", i, map[i]);
    }

    return S3_SUCCESS;
}